

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteActions::GetActionIndexByName
          (MADPComponentDiscreteActions *this,string *s,Index agentI)

{
  bool bVar1;
  __type_conflict _Var2;
  undefined8 uVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pAVar6;
  ostream *poVar7;
  uint in_EDX;
  string *in_RSI;
  long in_RDI;
  stringstream ss;
  string s2;
  const_iterator last;
  const_iterator it;
  stringstream ss_1;
  NamedDescribedEntity *in_stack_fffffffffffffbd8;
  E *in_stack_fffffffffffffbe0;
  __normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
  *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  Index in_stack_fffffffffffffc14;
  stringstream local_380 [16];
  ostream local_370 [376];
  ActionDiscrete *local_1f8;
  uint local_1ec;
  string local_1e8 [32];
  ActionDiscrete *local_1c8;
  __normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
  local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [396];
  uint local_1c;
  string *local_18;
  Index local_4;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
         in_stack_fffffffffffffc08);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_1c = in_EDX;
  local_18 = in_RSI;
  sVar4 = std::
          vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
          ::size((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58));
  if (in_EDX < sVar4) {
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)local_1c);
    local_1c0._M_current =
         (ActionDiscrete *)
         std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::begin
                   ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
                    in_stack_fffffffffffffbd8);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)local_1c);
    local_1c8 = (ActionDiscrete *)
                std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::end
                          ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
                           in_stack_fffffffffffffbd8);
    do {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar1) {
        std::__cxx11::stringstream::stringstream(local_380);
        poVar5 = std::operator<<(local_370,"GetActionIndexByName - action \"");
        poVar7 = std::operator<<(poVar5,local_18);
        poVar7 = std::operator<<(poVar7,"\" of agent ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1c);
        poVar7 = std::operator<<(poVar7," not found.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        uVar3 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        E::E((E *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),(char *)poVar5);
        __cxa_throw(uVar3,&E::typeinfo,E::~E);
      }
      __gnu_cxx::
      __normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
      ::operator*(&local_1c0);
      NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffbd8);
      _Var2 = std::operator==(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      if (_Var2) {
        pAVar6 = __gnu_cxx::
                 __normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                 ::operator*(&local_1c0);
        in_stack_fffffffffffffc14 = DiscreteEntity::GetIndex(&pAVar6->super_DiscreteEntity);
        local_4 = in_stack_fffffffffffffc14;
      }
      else {
        local_1f8 = (ActionDiscrete *)
                    __gnu_cxx::
                    __normal_iterator<const_ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                    ::operator++(in_stack_fffffffffffffbe8,
                                 (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
      }
      local_1ec = (uint)_Var2;
      std::__cxx11::string::~string(local_1e8);
    } while (local_1ec == 0);
    return local_4;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar5 = std::operator<<(local_1a8,"GetActionIndexByName -  Agent index (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
  poVar5 = std::operator<<(poVar5,") out of bounds! (_m_actionVecs contains actions for ");
  sVar4 = std::
          vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
          ::size((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
  std::operator<<(poVar5," agents...)\n");
  uVar3 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffbe0,(stringstream *)in_stack_fffffffffffffbd8);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteActions::GetActionIndexByName(const string &s,
                                                         Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteActions::GetActionIndexByName - not initialized!");

    if(agentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "GetActionIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ActionDiscrete>::const_iterator it = _m_actionVecs[agentI].begin();
    vector<ActionDiscrete>::const_iterator last = _m_actionVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    stringstream ss;
    ss << "GetActionIndexByName - action \"" << s << "\" of agent " << agentI <<
    " not found." << endl;
    throw E(ss.str().c_str());

}